

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

void nghttp2_stream_reschedule(nghttp2_stream *stream)

{
  uint64_t uVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *pnVar3;
  ulong uVar4;
  
  if (stream->queued != '\0') {
    pnVar2 = stream->dep_prev;
    while (pnVar3 = pnVar2, pnVar3 != (nghttp2_stream *)0x0) {
      nghttp2_pq_remove(&pnVar3->obq,&stream->pq_entry);
      uVar4 = (ulong)stream->pending_penalty + stream->last_writelen * 0x100;
      stream->cycle = uVar4 / (uint)stream->weight + pnVar3->descendant_last_cycle;
      stream->pending_penalty = (uint32_t)(uVar4 % (ulong)(uint)stream->weight);
      uVar1 = pnVar3->descendant_next_seq;
      pnVar3->descendant_next_seq = uVar1 + 1;
      stream->seq = uVar1;
      nghttp2_pq_push(&pnVar3->obq,&stream->pq_entry);
      pnVar3->last_writelen = stream->last_writelen;
      stream = pnVar3;
      pnVar2 = pnVar3->dep_prev;
    }
    return;
  }
  __assert_fail("stream->queued",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0xe5,"void nghttp2_stream_reschedule(nghttp2_stream *)");
}

Assistant:

void nghttp2_stream_reschedule(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  assert(stream->queued);

  dep_stream = stream->dep_prev;

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    stream_next_cycle(stream, dep_stream->descendant_last_cycle);
    stream->seq = dep_stream->descendant_next_seq++;

    nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);

    DEBUGF("stream: stream=%d obq resched cycle=%lu\n", stream->stream_id,
           stream->cycle);

    dep_stream->last_writelen = stream->last_writelen;
  }
}